

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setStateFrequencies
          (BeagleCPUImpl<double,_1,_0> *this,int stateFrequenciesIndex,double *inStateFrequencies)

{
  uint uVar1;
  double **ppdVar2;
  int iVar3;
  double *pdVar4;
  
  iVar3 = -5;
  if ((-1 < stateFrequenciesIndex) && (stateFrequenciesIndex < this->kEigenDecompCount)) {
    ppdVar2 = this->gStateFrequencies;
    uVar1 = this->kStateCount;
    pdVar4 = ppdVar2[(uint)stateFrequenciesIndex];
    if (pdVar4 == (double *)0x0) {
      pdVar4 = (double *)malloc((long)(int)uVar1 * 8);
      ppdVar2[(uint)stateFrequenciesIndex] = pdVar4;
      pdVar4 = this->gStateFrequencies[(uint)stateFrequenciesIndex];
      if (pdVar4 == (double *)0x0) {
        return -2;
      }
    }
    memcpy(pdVar4,inStateFrequencies,(ulong)uVar1 << 3);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setStateFrequencies(int stateFrequenciesIndex,
                                                     const double* inStateFrequencies) {
    if (stateFrequenciesIndex < 0 || stateFrequenciesIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gStateFrequencies[stateFrequenciesIndex] == NULL) {
        gStateFrequencies[stateFrequenciesIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount);
        if (gStateFrequencies[stateFrequenciesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gStateFrequencies[stateFrequenciesIndex], inStateFrequencies, kStateCount);

    return BEAGLE_SUCCESS;
}